

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O2

void readvalue(uint8 *base,uint32 typeoffset,uint32 valoffset,MOJOSHADER_effectValue *value,
              MOJOSHADER_effectObject *objects,MOJOSHADER_malloc m,void *d)

{
  uint *puVar1;
  MOJOSHADER_symbolType MVar2;
  MOJOSHADER_symbolClass MVar3;
  MOJOSHADER_effectSamplerState *pMVar4;
  uint uVar5;
  char *pcVar6;
  void *pvVar7;
  MOJOSHADER_symbolStructMember *pMVar8;
  ulong uVar9;
  uint uVar10;
  uint32 *ptr_1;
  int *piVar11;
  uint typeoffset_00;
  uint32 *ptr;
  uint *puVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  bool bVar20;
  MOJOSHADER_symbolTypeInfo *local_78;
  MOJOSHADER_symbolType *local_68;
  
  uVar9 = (ulong)typeoffset;
  MVar2 = *(MOJOSHADER_symbolType *)(base + uVar9);
  MVar3 = *(MOJOSHADER_symbolClass *)(base + uVar9 + 4);
  uVar13 = *(uint *)(base + uVar9 + 8);
  uVar16 = *(uint *)(base + uVar9 + 0xc);
  uVar14 = *(uint *)(base + uVar9 + 0x10);
  (value->type).parameter_type = MVar2;
  (value->type).parameter_class = MVar3;
  uVar5 = *(uint *)(base + uVar13);
  if ((ulong)uVar5 == 0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = (char *)(*m)(uVar5,d);
    memcpy(pcVar6,base + (ulong)uVar13 + 4,(ulong)uVar5);
  }
  value->name = pcVar6;
  uVar13 = *(uint *)(base + uVar16);
  if ((ulong)uVar13 == 0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = (char *)(*m)(uVar13,d);
    memcpy(pcVar6,base + (ulong)uVar16 + 4,(ulong)uVar13);
  }
  value->semantic = pcVar6;
  (value->type).elements = uVar14;
  if (MOJOSHADER_SYMCLASS_STRUCT < MVar3) {
    __assert_fail("valclass >= MOJOSHADER_SYMCLASS_SCALAR && valclass <= MOJOSHADER_SYMCLASS_STRUCT"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                  ,0x10f,
                  "void readvalue(const uint8 *, const uint32, const uint32, MOJOSHADER_effectValue *, MOJOSHADER_effectObject *, MOJOSHADER_malloc, void *)"
                 );
  }
  puVar12 = (uint *)(base + valoffset);
  if (MVar3 < MOJOSHADER_SYMCLASS_OBJECT) {
    if (2 < MVar2 - MOJOSHADER_SYMTYPE_BOOL) {
      __assert_fail("type >= MOJOSHADER_SYMTYPE_BOOL && type <= MOJOSHADER_SYMTYPE_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                    ,0x117,
                    "void readvalue(const uint8 *, const uint32, const uint32, MOJOSHADER_effectValue *, MOJOSHADER_effectObject *, MOJOSHADER_malloc, void *)"
                   );
    }
    uVar13 = *(uint *)(base + uVar9 + 0x14);
    uVar16 = *(uint *)(base + uVar9 + 0x18);
    (value->type).columns = uVar13;
    (value->type).rows = uVar16;
    iVar15 = (uVar14 + (uVar14 == 0)) * uVar16;
    value->value_count = iVar15 * 4;
    uVar16 = iVar15 * 0x10;
    pvVar7 = (*m)(uVar16,d);
    (value->field_4).values = pvVar7;
    uVar9 = 0;
    memset(pvVar7,0,(ulong)uVar16);
    uVar13 = uVar13 * 4;
    for (uVar18 = 0; uVar16 != uVar18; uVar18 = uVar18 + 0x10) {
      memcpy((void *)((long)(value->field_4).values + uVar18),(void *)(uVar9 + (long)puVar12),
             (ulong)uVar13);
      uVar9 = (ulong)((int)uVar9 + uVar13);
    }
  }
  else if (MVar3 == MOJOSHADER_SYMCLASS_OBJECT) {
    if (0xc < MVar2 - MOJOSHADER_SYMTYPE_STRING) {
      __assert_fail("type >= MOJOSHADER_SYMTYPE_STRING && type <= MOJOSHADER_SYMTYPE_VERTEXSHADER",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                    ,0x12d,
                    "void readvalue(const uint8 *, const uint32, const uint32, MOJOSHADER_effectValue *, MOJOSHADER_effectObject *, MOJOSHADER_malloc, void *)"
                   );
    }
    if (((MVar2 == MOJOSHADER_SYMTYPE_SAMPLERCUBE) ||
        ((MVar2 & (MOJOSHADER_SYMTYPE_VERTEXSHADER|MOJOSHADER_SYMTYPE_SAMPLERCUBE)) ==
         MOJOSHADER_SYMTYPE_SAMPLER2D)) ||
       ((MVar2 & (MOJOSHADER_SYMTYPE_VERTEXSHADER|MOJOSHADER_SYMTYPE_SAMPLERCUBE)) ==
        MOJOSHADER_SYMTYPE_SAMPLER)) {
      uVar13 = *puVar12;
      puVar12 = puVar12 + 1;
      value->value_count = uVar13;
      pvVar7 = (*m)(uVar13 * 0x48,d);
      (value->field_4).values = pvVar7;
      memset(pvVar7,0,(ulong)(uVar13 * 0x48));
      uVar16 = 0x98967b;
      for (lVar19 = 0; (ulong)uVar13 * 0x48 != lVar19; lVar19 = lVar19 + 0x48) {
        uVar14 = 0;
        if (uVar16 < 4) {
          typeoffset_00 = 0;
          uVar10 = 0;
LAB_0011f7ca:
          uVar16 = 0;
        }
        else {
          uVar10 = *puVar12 & 0xffffff5f;
          uVar5 = uVar16 & 0xfffffffc;
          if (uVar5 == 4) {
            puVar12 = puVar12 + 1;
LAB_0011f7c8:
            typeoffset_00 = 0;
            goto LAB_0011f7ca;
          }
          if (uVar5 == 8) {
            puVar12 = puVar12 + 2;
            goto LAB_0011f7c8;
          }
          typeoffset_00 = puVar12[2];
          if (uVar5 == 0xc) {
            puVar12 = puVar12 + 3;
            goto LAB_0011f7ca;
          }
          uVar14 = puVar12[3];
          puVar12 = puVar12 + 4;
          uVar16 = uVar16 - 0x10;
        }
        pMVar4 = (value->field_4).valuesSS;
        puVar1 = (uint *)((long)&pMVar4->type + lVar19);
        *puVar1 = uVar10;
        readvalue(base,typeoffset_00,uVar14,(MOJOSHADER_effectValue *)(puVar1 + 2),objects,m,d);
        if (uVar10 == 4) {
          objects[**(int **)((long)&(pMVar4->value).field_4 + lVar19)].type = MVar2;
        }
      }
    }
    else {
      uVar14 = uVar14 + (uVar14 == 0);
      value->value_count = uVar14;
      uVar14 = uVar14 * 4;
      pvVar7 = (*m)(uVar14,d);
      (value->field_4).values = pvVar7;
      memcpy(pvVar7,puVar12,(ulong)uVar14);
      for (uVar9 = 0; uVar9 < value->value_count; uVar9 = uVar9 + 1) {
        objects[*(int *)((long)(value->field_4).values + uVar9 * 4)].type = MVar2;
      }
    }
  }
  else {
    uVar13 = *(uint *)(base + uVar9 + 0x14);
    piVar11 = (int *)(base + uVar9 + 0x18);
    (value->type).member_count = uVar13;
    pMVar8 = (MOJOSHADER_symbolStructMember *)(*m)(uVar13 * 0x28,d);
    (value->type).members = pMVar8;
    uVar13 = 0x989667;
    lVar19 = 0x20;
    uVar16 = 0;
    for (uVar9 = 0; uVar9 < (value->type).member_count; uVar9 = uVar9 + 1) {
      pMVar8 = (value->type).members;
      if (uVar13 < 4) {
        local_78 = (MOJOSHADER_symbolTypeInfo *)((long)pMVar8 + lVar19 + -0x18);
        local_68 = (MOJOSHADER_symbolType *)((long)pMVar8 + lVar19 + -0x14);
        *local_68 = MOJOSHADER_SYMTYPE_VOID;
LAB_0011f8c6:
        local_78->parameter_class = MOJOSHADER_SYMCLASS_SCALAR;
        uVar18 = 0;
        uVar10 = 0;
      }
      else {
        *(int *)((long)pMVar8 + lVar19 + -0x14) = *piVar11;
        uVar5 = uVar13 & 0xfffffffc;
        if (uVar5 == 4) {
          piVar11 = piVar11 + 1;
          local_78 = &pMVar8[uVar9].info;
          local_68 = &pMVar8[uVar9].info.parameter_type;
          goto LAB_0011f8c6;
        }
        local_78 = (MOJOSHADER_symbolTypeInfo *)((long)pMVar8 + lVar19 + -0x18);
        local_68 = (MOJOSHADER_symbolType *)((long)pMVar8 + lVar19 + -0x14);
        local_78->parameter_class = piVar11[1];
        uVar10 = 0;
        if (uVar5 == 8) {
          piVar11 = piVar11 + 2;
          uVar18 = 0;
          uVar10 = 0;
        }
        else {
          uVar18 = (ulong)(uint)piVar11[2];
          if (uVar5 == 0xc) {
            piVar11 = piVar11 + 3;
          }
          else {
            piVar11 = piVar11 + 4;
            uVar10 = uVar13 - 0x10;
          }
        }
      }
      uVar13 = *(uint *)(base + uVar18);
      if ((ulong)uVar13 == 0) {
        pvVar7 = (void *)0x0;
      }
      else {
        pvVar7 = (*m)(uVar13,d);
        memcpy(pvVar7,base + uVar18 + 4,(ulong)uVar13);
      }
      *(void **)((long)pMVar8 + lVar19 + -0x20) = pvVar7;
      if (uVar10 < 4) {
        *(undefined4 *)((long)pMVar8 + lVar19 + -8) = 0;
        iVar15 = 0;
LAB_0011f968:
        *(undefined4 *)((long)pMVar8 + lVar19 + -0xc) = 0;
LAB_0011f96e:
        uVar13 = 0;
        iVar17 = 0;
      }
      else {
        iVar15 = *piVar11;
        *(int *)((long)pMVar8 + lVar19 + -8) = iVar15;
        if ((uVar10 & 0xfffffffc) == 4) {
          piVar11 = piVar11 + 1;
          goto LAB_0011f968;
        }
        *(int *)((long)pMVar8 + lVar19 + -0xc) = piVar11[1];
        if ((uVar10 & 0xfffffffc) == 8) {
          piVar11 = piVar11 + 2;
          goto LAB_0011f96e;
        }
        iVar17 = piVar11[2];
        piVar11 = piVar11 + 3;
        uVar13 = uVar10 - 0xc;
      }
      *(int *)((long)pMVar8 + lVar19 + -0x10) = iVar17;
      if (MOJOSHADER_SYMCLASS_VECTOR < local_78->parameter_class) {
        __assert_fail("mem->info.parameter_class >= MOJOSHADER_SYMCLASS_SCALAR && mem->info.parameter_class <= MOJOSHADER_SYMCLASS_VECTOR"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                      ,0x178,
                      "void readvalue(const uint8 *, const uint32, const uint32, MOJOSHADER_effectValue *, MOJOSHADER_effectObject *, MOJOSHADER_malloc, void *)"
                     );
      }
      if (2 < *local_68 - MOJOSHADER_SYMTYPE_BOOL) {
        __assert_fail("mem->info.parameter_type >= MOJOSHADER_SYMTYPE_BOOL && mem->info.parameter_type <= MOJOSHADER_SYMTYPE_FLOAT"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                      ,0x17a,
                      "void readvalue(const uint8 *, const uint32, const uint32, MOJOSHADER_effectValue *, MOJOSHADER_effectObject *, MOJOSHADER_malloc, void *)"
                     );
      }
      *(undefined4 *)((long)pMVar8 + lVar19 + -4) = 0;
      *(undefined8 *)((long)&pMVar8->name + lVar19) = 0;
      uVar16 = uVar16 + (iVar15 + (uint)(iVar15 == 0)) * iVar17 * 4;
      lVar19 = lVar19 + 0x28;
    }
    (value->type).columns = uVar16;
    (value->type).rows = 1;
    uVar16 = (uVar14 + (uVar14 == 0)) * uVar16;
    value->value_count = uVar16;
    uVar16 = uVar16 * 4;
    pvVar7 = (*m)(uVar16,d);
    (value->field_4).values = pvVar7;
    uVar13 = 0;
    memset(pvVar7,0,(ulong)uVar16);
    lVar19 = 0;
    iVar15 = 0;
    do {
      for (uVar9 = 0; uVar9 < (value->type).member_count; uVar9 = uVar9 + 1) {
        pMVar8 = (value->type).members;
        iVar17 = pMVar8[uVar9].info.elements * pMVar8[uVar9].info.rows;
        lVar19 = (long)(int)lVar19;
        while (bVar20 = iVar17 != 0, iVar17 = iVar17 + -1, bVar20) {
          memcpy((void *)(lVar19 * 4 + (long)(value->field_4).values),
                 (void *)((long)iVar15 + (long)piVar11),(ulong)(pMVar8[uVar9].info.columns << 2));
          lVar19 = lVar19 + 4;
          pMVar8 = (value->type).members;
          iVar15 = iVar15 + pMVar8[uVar9].info.columns * 4;
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < uVar14);
  }
  return;
}

Assistant:

static void readvalue(const uint8 *base,
                      const uint32 typeoffset,
                      const uint32 valoffset,
                      MOJOSHADER_effectValue *value,
                      MOJOSHADER_effectObject *objects,
                      MOJOSHADER_malloc m,
                      void *d)
{
    int i, j, k;
    const uint8 *typeptr = base + typeoffset;
    const uint8 *valptr = base + valoffset;
    unsigned int typelen = 9999999;  // !!! FIXME
    const uint32 type = readui32(&typeptr, &typelen);
    const uint32 valclass = readui32(&typeptr, &typelen);
    const uint32 name = readui32(&typeptr, &typelen);
    const uint32 semantic = readui32(&typeptr, &typelen);
    const uint32 numelements = readui32(&typeptr, &typelen);

    value->type.parameter_type = (MOJOSHADER_symbolType) type;
    value->type.parameter_class = (MOJOSHADER_symbolClass) valclass;
    value->name = readstring(base, name, m, d);
    value->semantic = readstring(base, semantic, m, d);
    value->type.elements = numelements;

    /* Class sanity check */
    assert(valclass >= MOJOSHADER_SYMCLASS_SCALAR && valclass <= MOJOSHADER_SYMCLASS_STRUCT);

    if (valclass == MOJOSHADER_SYMCLASS_SCALAR
     || valclass == MOJOSHADER_SYMCLASS_VECTOR
     || valclass == MOJOSHADER_SYMCLASS_MATRIX_ROWS
     || valclass == MOJOSHADER_SYMCLASS_MATRIX_COLUMNS)
    {
        /* These classes only ever contain scalar values */
        assert(type >= MOJOSHADER_SYMTYPE_BOOL && type <= MOJOSHADER_SYMTYPE_FLOAT);

        const uint32 columncount = readui32(&typeptr, &typelen);
        const uint32 rowcount = readui32(&typeptr, &typelen);

        value->type.columns = columncount;
        value->type.rows = rowcount;

        uint32 siz = 4 * rowcount;
        if (numelements > 0)
            siz *= numelements;
        value->value_count = siz;
        siz *= 4;
        value->values = m(siz, d);
        memset(value->values, '\0', siz);
        siz /= 16;
        for (i = 0; i < siz; i++)
            memcpy(value->valuesF + (i << 2), valptr + ((columncount << 2) * i), columncount << 2);
    } // if
    else if (valclass == MOJOSHADER_SYMCLASS_OBJECT)
    {
        /* This class contains either samplers or "objects" */
        assert(type >= MOJOSHADER_SYMTYPE_STRING && type <= MOJOSHADER_SYMTYPE_VERTEXSHADER);

        if (type == MOJOSHADER_SYMTYPE_SAMPLER
         || type == MOJOSHADER_SYMTYPE_SAMPLER1D
         || type == MOJOSHADER_SYMTYPE_SAMPLER2D
         || type == MOJOSHADER_SYMTYPE_SAMPLER3D
         || type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
        {
            unsigned int vallen = 9999999; // !!! FIXME
            const uint32 numstates = readui32(&valptr, &vallen);

            value->value_count = numstates;

            const uint32 siz = sizeof(MOJOSHADER_effectSamplerState) * numstates;
            value->values = m(siz, d);
            memset(value->values, '\0', siz);

            for (i = 0; i < numstates; i++)
            {
                MOJOSHADER_effectSamplerState *state = &value->valuesSS[i];
                const uint32 stype = readui32(&valptr, &vallen) & ~0xA0;
                /*const uint32 FIXME =*/ readui32(&valptr, &vallen);
                const uint32 statetypeoffset = readui32(&valptr, &vallen);
                const uint32 statevaloffset = readui32(&valptr, &vallen);

                state->type = (MOJOSHADER_samplerStateType) stype;
                readvalue(base, statetypeoffset, statevaloffset,
                          &state->value, objects,
                          m, d);
                if (stype == MOJOSHADER_SAMP_TEXTURE)
                    objects[state->value.valuesI[0]].type = (MOJOSHADER_symbolType) type;
            } // for
        } // if
        else
        {
            uint32 numobjects = 1;
            if (numelements > 0)
                numobjects = numelements;

            value->value_count = numobjects;

            const uint32 siz = 4 * numobjects;
            value->values = m(siz, d);
            memcpy(value->values, valptr, siz);

            for (i = 0; i < value->value_count; i++)
                objects[value->valuesI[i]].type = (MOJOSHADER_symbolType) type;
        } // else
    } // else if
    else if (valclass == MOJOSHADER_SYMCLASS_STRUCT)
    {
        uint32 siz;

        value->type.member_count = readui32(&typeptr, &typelen);
        siz = value->type.member_count * sizeof (MOJOSHADER_symbolStructMember);
        value->type.members = (MOJOSHADER_symbolStructMember *) m(siz, d);

        uint32 structsize = 0;
        for (i = 0; i < value->type.member_count; i++)
        {
            MOJOSHADER_symbolStructMember *mem = &value->type.members[i];

            mem->info.parameter_type = (MOJOSHADER_symbolType) readui32(&typeptr, &typelen);
            mem->info.parameter_class = (MOJOSHADER_symbolClass) readui32(&typeptr, &typelen);

            const uint32 memname = readui32(&typeptr, &typelen);
            /*const uint32 memsemantic =*/ readui32(&typeptr, &typelen);
            mem->name = readstring(base, memname, m, d);

            mem->info.elements = readui32(&typeptr, &typelen);
            mem->info.columns = readui32(&typeptr, &typelen);
            mem->info.rows = readui32(&typeptr, &typelen);

            // !!! FIXME: Nested structs! -flibit
            assert(mem->info.parameter_class >= MOJOSHADER_SYMCLASS_SCALAR
                && mem->info.parameter_class <= MOJOSHADER_SYMCLASS_VECTOR);
            assert(mem->info.parameter_type >= MOJOSHADER_SYMTYPE_BOOL
                && mem->info.parameter_type <= MOJOSHADER_SYMTYPE_FLOAT);
            mem->info.member_count = 0;
            mem->info.members = NULL;

            uint32 memsize = 4 * mem->info.rows;
            if (mem->info.elements > 0)
                memsize *= mem->info.elements;
            structsize += memsize;
        } // for

        value->type.columns = structsize;
        value->type.rows = 1;
        value->value_count = structsize;
        if (numelements > 0)
            value->value_count *= numelements;

        siz = value->value_count * 4;
        value->values = m(siz, d);
        memset(value->values, '\0', siz);
        int dst_offset = 0, src_offset = 0;
        i = 0;
        do
        {
            for (j = 0; j < value->type.member_count; j++)
            {
                siz = value->type.members[j].info.rows * value->type.members[j].info.elements;
                for (k = 0; k < siz; k++)
                {
                    memcpy(value->valuesF + dst_offset,
                           typeptr + src_offset, /* Yes, typeptr. -flibit */
                           value->type.members[j].info.columns << 2);
                    dst_offset += 4;
                    src_offset += value->type.members[j].info.columns << 2;
                } // for
            }
        } while (++i < numelements);
    } // else if
}